

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O0

REF_BOOL ref_phys_wall_distance_bc(REF_INT bc)

{
  undefined1 local_d;
  REF_INT bc_local;
  
  local_d = true;
  if (((((bc != 4000) && (local_d = true, bc != -4000)) && (local_d = true, bc != 0xfeb)) &&
      ((local_d = true, bc != 0x1004 && (local_d = true, bc != 0x100e)))) &&
     ((local_d = true, bc != -0x100e &&
      ((local_d = true, bc != -0x1004 && (local_d = true, bc != 0x1838)))))) {
    local_d = bc == 0x1842;
  }
  return (REF_BOOL)local_d;
}

Assistant:

REF_FCN REF_BOOL ref_phys_wall_distance_bc(REF_INT bc) {
  return (bc == 4000 ||  /* viscous_solid */
          bc == -4000 || /* viscous_solid_trs */
          bc == 4075 ||  /* viscous_wall_rough */
          bc == 4100 ||  /* viscous_wall_function */
          bc == 4110 ||  /* viscous_weak_wall */
          bc == -4110 || /* viscous_weak_trs */
          bc == -4100 || /* viscous_wf_trs */
          bc == 6200 ||  /* block_interface */
          bc == 6210);   /* filter */
}